

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O1

int __thiscall MPEGStreamReader::readPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  uint8_t *puVar7;
  uint8_t *puVar8;
  _func_int **pp_Var9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar4);
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  lVar11 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar11;
  lVar1 = this->m_curDts;
  lVar2 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar11 + lVar1) - iVar4 * lVar2;
  puVar8 = (this->super_AbstractStreamReader).m_curPos;
  puVar10 = puVar8;
  if (this->m_syncToStream == false) {
    puVar7 = NALUnit::findNALWithStartCode
                       (puVar8,(this->super_AbstractStreamReader).m_bufEnd,this->m_longCodesAllowed)
    ;
    puVar10 = (this->super_AbstractStreamReader).m_bufEnd;
    if (puVar7 != puVar10) {
      this->m_syncToStream = true;
      puVar10 = puVar7;
    }
    (this->super_AbstractStreamReader).m_curPos = puVar10;
    this->m_processedBytes = this->m_processedBytes + (long)((int)puVar10 - (int)puVar8);
    if (this->m_syncToStream != true) {
      return 1;
    }
  }
  iVar4 = (int)puVar10;
  puVar8 = (this->super_AbstractStreamReader).m_bufEnd;
  puVar7 = (this->super_AbstractStreamReader).m_curPos + 3;
  if (puVar8 < puVar7) {
    puVar7 = puVar8;
  }
  puVar8 = NALUnit::findNALWithStartCode(puVar7,puVar8,this->m_longCodesAllowed);
  if (puVar8 == (this->super_AbstractStreamReader).m_bufEnd) {
    storeBufferRest(this);
    return 1;
  }
  uVar5 = bufFromNAL(this);
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    pp_Var9 = (this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
              _vptr_BaseAbstractStreamReader;
    lVar11 = this->m_curDts;
    this->m_shortStartCodes = uVar5 < 4;
    uVar12 = (ulong)uVar5;
    puVar8 = (this->super_AbstractStreamReader).m_curPos + uVar12;
    while (iVar6 = (*pp_Var9[0x1f])(this,puVar8), iVar6 == 5) {
      puVar10 = NALUnit::findNALWithStartCode
                          ((this->super_AbstractStreamReader).m_curPos + uVar12,
                           (this->super_AbstractStreamReader).m_bufEnd,this->m_longCodesAllowed);
      this->m_processedBytes =
           (int64_t)(puVar10 +
                    (this->m_processedBytes - (long)(this->super_AbstractStreamReader).m_curPos));
      (this->super_AbstractStreamReader).m_curPos = puVar10;
      if (puVar10 == (this->super_AbstractStreamReader).m_bufEnd) {
        this->m_syncToStream = false;
        iVar6 = -10;
        break;
      }
      uVar5 = bufFromNAL(this);
      uVar12 = (ulong)uVar5;
      puVar8 = (this->super_AbstractStreamReader).m_curPos + uVar12;
      pp_Var9 = (this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader;
    }
    iVar4 = (int)puVar10;
    if (iVar6 == -10) {
      storeBufferRest(this);
      this->m_lastDecodedPos = (uint8_t *)0x0;
      iVar6 = 1;
      bVar3 = false;
    }
    else {
      lVar1 = this->m_curDts;
      if (lVar11 == lVar1) {
        iVar6 = 1;
        bVar3 = true;
      }
      else {
        lVar11 = (this->super_AbstractStreamReader).m_timeOffset;
        avPacket->pts = this->m_curPts + lVar11;
        lVar2 = this->m_pcrIncPerFrame;
        iVar6 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0x17])(this);
        avPacket->dts = (lVar1 + lVar11) - iVar6 * lVar2;
        iVar6 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0x1c])(this);
        if ((char)iVar6 != '\0') {
          *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
        }
        iVar6 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
        if ((char)iVar6 != '\0') {
          *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
        }
        bVar3 = false;
        iVar6 = 0;
        if (this->m_spsPpsFound == true) {
          *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
          bVar3 = false;
          iVar6 = 0;
        }
      }
    }
    if (!bVar3) {
      return iVar6;
    }
  }
  puVar10 = (this->super_AbstractStreamReader).m_curPos;
  puVar7 = (this->super_AbstractStreamReader).m_bufEnd;
  puVar8 = puVar10 + 0x8000;
  if (puVar8 < puVar7) {
    puVar7 = puVar8;
  }
  puVar8 = NALUnit::findNALWithStartCode(puVar10 + uVar5,puVar7,this->m_longCodesAllowed);
  if (puVar8 == puVar7) {
    if (*puVar8 == '\0') {
      if (puVar8[-1] != '\0') goto LAB_001bf075;
      puVar10 = puVar8 + -1;
      lVar11 = -2;
    }
    else {
      if (((*puVar8 != '\x01') || (puVar8[-1] != '\0')) || (puVar8[-2] != '\0')) goto LAB_001bf075;
      puVar10 = puVar8 + -2;
      lVar11 = -3;
    }
    puVar7 = puVar8 + lVar11;
    puVar8 = puVar8 + lVar11;
    if (*puVar7 != '\0') {
      puVar8 = puVar10;
    }
  }
LAB_001bf075:
  avPacket->data = (this->super_AbstractStreamReader).m_curPos;
  avPacket->size = (int)puVar8 - iVar4;
  lVar11 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar11;
  lVar1 = this->m_curDts;
  lVar2 = this->m_pcrIncPerFrame;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar11 + lVar1) - iVar4 * lVar2;
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1c])(this);
  if ((char)iVar4 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
  }
  iVar4 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
  if ((char)iVar4 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
  }
  if (this->m_spsPpsFound == true) {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
  }
  (this->super_AbstractStreamReader).m_curPos = puVar8;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_processedBytes = this->m_processedBytes + (long)avPacket->size;
  return 0;
}

Assistant:

int MPEGStreamReader::readPacket(AVPacket& avPacket)
{
    // LTRACE(LT_DEBUG, 0, "MPEGStreamReader::readPacket");
    avPacket.codec = this;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    const uint8_t* prevPos = m_curPos;
    if (!m_syncToStream)
    {
        uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos, m_bufEnd, m_longCodesAllowed);
        if (nal != m_bufEnd)
        {
            m_syncToStream = true;
            m_curPos = nal;
        }
        else
            m_curPos = m_bufEnd;
        const int bytesProcessed = static_cast<int>(m_curPos - prevPos);
        m_processedBytes += bytesProcessed;
        prevPos = m_curPos;
        if (!m_syncToStream)
            return NEED_MORE_DATA;
    }

    const uint8_t* nextNal =
        NALUnit::findNALWithStartCode((std::min)(m_curPos + 3, m_bufEnd), m_bufEnd, m_longCodesAllowed);
    if (nextNal == m_bufEnd)
    {
        storeBufferRest();
        return NEED_MORE_DATA;
    }

    int isNal = bufFromNAL();
    if (isNal)
    {
        const int64_t prevDts = m_curDts;
        m_shortStartCodes = isNal < 4;
        int rez;
        while (true)
        {
            rez = decodeNal(m_curPos + isNal);
            if (rez != UNIT_SKIPPED)
                break;
            uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, m_bufEnd, m_longCodesAllowed);
            // assert(nal < findEnd); // if unit is skipped, next unit MUST be in buffer

            m_processedBytes += nal - m_curPos;
            prevPos = m_curPos = nal;
            if (nal == m_bufEnd)
            {
                rez = NOT_ENOUGH_BUFFER;
                m_syncToStream = false;
                break;
            }
            isNal = bufFromNAL();
        }

        if (rez == NOT_ENOUGH_BUFFER)
        {
            storeBufferRest();
            m_lastDecodedPos = nullptr;
            return NEED_MORE_DATA;
        }
        if (prevDts != m_curDts)
        {
            // stream interleaving is allowed during one stream packet

            avPacket.pts = m_curPts + m_timeOffset;
            avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back to 1 frame;
            if (isIFrame())
                avPacket.flags |= AVPacket::IS_IFRAME;
            if (isPriorityData(&avPacket))
                avPacket.flags |= AVPacket::PRIORITY_DATA;
            if (m_spsPpsFound)
                avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

            return 0;  // return zero AV packet for new frame
        }
    }
    uint8_t* findEnd = (std::min)(m_bufEnd, m_curPos + MAX_AV_PACKET_SIZE);
    uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, findEnd, m_longCodesAllowed);

    if (nal == findEnd)
    {
        if (nal[0] == 1 && nal[-1] == 0 && nal[-2] == 0)
        {
            nal -= 2;
            if (nal[-1] == 0)
                nal--;
        }
        else if (nal[0] == 0 && nal[-1] == 0)
        {
            nal--;
            if (nal[-1] == 0)
                nal--;
        }
    }

    const int bytesProcessed = static_cast<int>(nal - prevPos);
    avPacket.data = m_curPos;
    avPacket.size = bytesProcessed;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    if (isIFrame())
        avPacket.flags |= AVPacket::IS_IFRAME;
    if (isPriorityData(&avPacket))
        avPacket.flags |= AVPacket::PRIORITY_DATA;
    if (m_spsPpsFound)
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

    m_curPos = nal;

    m_tmpBufferLen = 0;
    m_processedBytes += avPacket.size;

    return 0;
}